

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

PAL_ERROR CorUnix::CreateInitialProcessAndThreadObjects(CPalThread *pThread)

{
  undefined8 local_58;
  HANDLE hProcess;
  CObjectAttributes oa;
  CProcProcessLocalData *pLocalData;
  IDataLock *pDataLock;
  IPalObject *pobjProcess;
  HANDLE hThread;
  CPalThread *pCStack_10;
  PAL_ERROR palError;
  CPalThread *pThread_local;
  
  hThread._4_4_ = 0;
  pDataLock = (IDataLock *)0x0;
  pCStack_10 = pThread;
  CObjectAttributes::CObjectAttributes((CObjectAttributes *)&hProcess);
  hThread._4_4_ = CreateThreadObject(pCStack_10,pCStack_10,&pobjProcess);
  if (hThread._4_4_ == 0) {
    (**(code **)(*g_pObjectManager + 0x20))(g_pObjectManager,pCStack_10,pobjProcess);
    hThread._4_4_ =
         (**(code **)*g_pObjectManager)(g_pObjectManager,pCStack_10,otProcess,&hProcess,&pDataLock);
    if (hThread._4_4_ == 0) {
      hThread._4_4_ =
           (*pDataLock->_vptr_IDataLock[3])
                     (pDataLock,pCStack_10,1,&pLocalData,&oa.pSecurityAttributes);
      if (hThread._4_4_ == 0) {
        (oa.pSecurityAttributes)->nLength = gPID;
        *(undefined4 *)&(oa.pSecurityAttributes)->field_0x4 = 2;
        (*(code *)**(undefined8 **)pLocalData)(pLocalData,pCStack_10,1);
        hThread._4_4_ =
             (**(code **)(*g_pObjectManager + 8))
                       (g_pObjectManager,pCStack_10,pDataLock,&aotProcess,0x1f0fff,&local_58,
                        &g_pobjProcess);
        pDataLock = (IDataLock *)0x0;
        if (hThread._4_4_ == 0) {
          (**(code **)(*g_pObjectManager + 0x20))(g_pObjectManager,pCStack_10,local_58);
        }
        else {
          fprintf(_stderr,"] %s %s:%d","CreateInitialProcessAndThreadObjects",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                  ,0x717);
          fprintf(_stderr,"Failure registering process object");
        }
      }
      else {
        fprintf(_stderr,"] %s %s:%d","CreateInitialProcessAndThreadObjects",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                ,0x6fd);
        fprintf(_stderr,"Unable to access local data");
      }
    }
    else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
  }
  if (pDataLock != (IDataLock *)0x0) {
    (*pDataLock->_vptr_IDataLock[8])(pDataLock,pCStack_10);
  }
  return hThread._4_4_;
}

Assistant:

PAL_ERROR
CorUnix::CreateInitialProcessAndThreadObjects(
    CPalThread *pThread
    )
{
    PAL_ERROR palError = NO_ERROR;
    HANDLE hThread;
    IPalObject *pobjProcess = NULL;
    IDataLock *pDataLock;
    CProcProcessLocalData *pLocalData;
    CObjectAttributes oa;
    HANDLE hProcess;

    //
    // Create initial thread object
    //

    palError = CreateThreadObject(pThread, pThread, &hThread);
    if (NO_ERROR != palError)
    {
        goto CreateInitialProcessAndThreadObjectsExit;
    }

    //
    // This handle isn't needed
    //

    (void) g_pObjectManager->RevokeHandle(pThread, hThread);

    //
    // Create and initialize process object
    //

    palError = g_pObjectManager->AllocateObject(
        pThread,
        &otProcess,
        &oa,
        &pobjProcess
        );

    if (NO_ERROR != palError)
    {
        ERROR("Unable to allocate process object");
        goto CreateInitialProcessAndThreadObjectsExit;
    }

    palError = pobjProcess->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void **>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        ASSERT("Unable to access local data");
        goto CreateInitialProcessAndThreadObjectsExit;
    }

    pLocalData->dwProcessId = gPID;
    pLocalData->ps = PS_RUNNING;
    pDataLock->ReleaseLock(pThread, TRUE);

    palError = g_pObjectManager->RegisterObject(
        pThread,
        pobjProcess,
        &aotProcess,
        PROCESS_ALL_ACCESS,
        &hProcess,
        &g_pobjProcess
        );

    //
    // pobjProcess is invalidated by the call to RegisterObject, so
    // NULL it out here to prevent it from being released later
    //

    pobjProcess = NULL;

    if (NO_ERROR != palError)
    {
        ASSERT("Failure registering process object");
        goto CreateInitialProcessAndThreadObjectsExit;
    }

    //
    // There's no need to keep this handle around, so revoke
    // it now
    //

    g_pObjectManager->RevokeHandle(pThread, hProcess);

CreateInitialProcessAndThreadObjectsExit:

    if (NULL != pobjProcess)
    {
        pobjProcess->ReleaseReference(pThread);
    }

    return palError;
}